

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O1

GLuint glcts::bitCount(GLuint input)

{
  bool bVar1;
  GLuint GVar2;
  ulong uVar3;
  
  GVar2 = 0;
  if (input != 0) {
    uVar3 = (ulong)input;
    do {
      GVar2 = GVar2 + (input & 1);
      uVar3 = uVar3 >> 1;
      bVar1 = 1 < input;
      input = (uint)uVar3;
    } while (bVar1);
  }
  return GVar2;
}

Assistant:

static GLuint bitCount(GLuint input)
{
	GLuint result = 0;
	while (input)
	{
		if (input & 1)
		{
			result += 1;
		}
		input >>= 1;
	}
	return result;
}